

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linked_list.h
# Opt level: O0

void __thiscall
data_structures::LinkedList<data_structures::SymbolTableElement<int,_int>_>::~LinkedList
          (LinkedList<data_structures::SymbolTableElement<int,_int>_> *this)

{
  bool bVar1;
  LinkedList<data_structures::SymbolTableElement<int,_int>_> *this_local;
  
  this->_vptr_LinkedList = (_func_int **)&PTR__LinkedList_00116ba0;
  while( true ) {
    bVar1 = isEmpty(this);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    deleteFromHeader(this);
  }
  if (this->_header != (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0) {
    (*this->_header->_vptr_ListNode[1])();
  }
  this->_header = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  this->_tail = (ListNode<data_structures::SymbolTableElement<int,_int>_> *)0x0;
  this->_size = 0;
  return;
}

Assistant:

inline
    LinkedList<T>::~LinkedList(){
        while (!isEmpty()) {
            deleteFromHeader();
        }
        delete _header;
        _header = 0;
        _tail = 0;
        _size = 0;
    }